

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall QMakeParser::message(QMakeParser *this,int type,QString *msg)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  ProFile *this_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)(in_RDI + 0x30) & 1) == 0) && (*(long *)(in_RDI + 0x60) != 0)) {
    this_00 = *(ProFile **)(in_RDI + 0x60);
    ProFile::fileName(this_00);
    (*(code *)**(undefined8 **)this_00)(this_00,in_ESI,in_RDX,local_20,*(undefined4 *)(in_RDI + 8));
    QString::~QString((QString *)0x3155d6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeParser::message(int type, const QString &msg) const
{
    if (!m_inError && m_handler)
        m_handler->message(type, msg, m_proFile->fileName(), m_lineNo);
}